

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.c
# Opt level: O0

axbStatus_t axbMatGetNonzerosSize(axbMat_s *mat,size_t *num_nonzeros)

{
  double dVar1;
  double val;
  size_t j;
  size_t i;
  size_t nnz;
  size_t *num_nonzeros_local;
  axbMat_s *mat_local;
  
  if (mat->storage_type == AXB_STORAGE_DENSE) {
    i = 0;
    for (j = 0; j < mat->rows; j = j + 1) {
      for (val = 0.0; (ulong)val < mat->cols; val = (double)((long)val + 1)) {
        dVar1 = *(double *)((long)mat->values + (j * mat->cols + (long)val) * 8);
        if (dVar1 < 0.0) {
LAB_00106efd:
          i = i + 1;
        }
        else if (0.0 < dVar1) goto LAB_00106efd;
      }
    }
    *num_nonzeros = i;
  }
  else {
    *num_nonzeros = mat->nonzeros;
  }
  return 0;
}

Assistant:

axbStatus_t axbMatGetNonzerosSize(const struct axbMat_s *mat, size_t *num_nonzeros)
{
  if (mat->storage_type == AXB_STORAGE_DENSE) { // count the number of actual nonzeros
    size_t nnz = 0;
    for (size_t i=0; i<mat->rows; ++i)
      for (size_t j=0; j<mat->cols; ++j) {
        double val = ((double*)mat->values)[i*mat->cols + j];
        if (val < 0 || val > 0) ++nnz;
      }
    *num_nonzeros = nnz;
  } else {
    *num_nonzeros = mat->nonzeros;
  }
  return 0;
}